

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extract_depthmap.cpp
# Opt level: O0

int parse_huawei_trailer
              (uchar *data,size_t size,uchar **cv,size_t *cv_size,uchar **dm,size_t *dm_size,
              size_t *dm_width,size_t *dm_height,image_type_t *dm_type,uint32_t *orientation)

{
  uint16_t uVar1;
  uint16_t uVar2;
  uint32_t uVar3;
  uchar *puVar4;
  uchar *data_00;
  uchar *jpeg_data_start;
  uint32_t jpeg_size;
  uint16_t height;
  uint16_t width;
  uchar *dm_data_start;
  uchar *dm_start;
  uint32_t dm_block_size;
  uchar *iter;
  size_t dm_header_size;
  size_t *dm_size_local;
  uchar **dm_local;
  size_t *cv_size_local;
  uchar **cv_local;
  size_t size_local;
  uchar *data_local;
  
  if (data + (size - 8) < data) {
    data_local._4_4_ = 0;
  }
  else if (*(long *)(data + (size - 8)) == 0x6e456874706544) {
    puVar4 = data + (size - 0xc);
    if (puVar4 < data) {
      data_local._4_4_ = 0;
    }
    else {
      uVar3 = read_ui32(puVar4);
      puVar4 = puVar4 + -(ulong)uVar3;
      if (puVar4 < data) {
        data_local._4_4_ = 0;
      }
      else {
        print_hex(file_data,puVar4,0x40);
        switch(puVar4[3]) {
        case '\x10':
          *orientation = 1;
          break;
        case '\x11':
          *orientation = 8;
          break;
        case '\x12':
          *orientation = 3;
          break;
        case '\x13':
          *orientation = 6;
        }
        uVar1 = read_ui16(puVar4 + 0xc);
        uVar2 = read_ui16(puVar4 + 0xe);
        if (uVar3 < (uint)uVar1 * (uint)uVar2) {
          data_local._4_4_ = 0;
        }
        else {
          data_00 = puVar4 + -0xc;
          if (data_00 < data) {
            data_local._4_4_ = 0;
          }
          else if ((*(int *)(puVar4 + -8) == 0x666f6465) &&
                  (uVar3 = read_ui32(puVar4 + -4), uVar3 == 0)) {
            uVar3 = read_ui32(data_00);
            if (data_00 + -(ulong)uVar3 < data) {
              data_local._4_4_ = 0;
            }
            else {
              *cv = data_00 + -(ulong)uVar3;
              *cv_size = (ulong)uVar3;
              *dm = puVar4 + 0x40;
              *dm_size = (long)(int)((uint)uVar1 * (uint)uVar2);
              *dm_width = (ulong)uVar1;
              *dm_height = (ulong)uVar2;
              *dm_type = TYPE_RAW;
              data_local._4_4_ = 1;
            }
          }
          else {
            data_local._4_4_ = 0;
          }
        }
      }
    }
  }
  else {
    data_local._4_4_ = 0;
  }
  return data_local._4_4_;
}

Assistant:

int parse_huawei_trailer(const unsigned char *data, const size_t size,
                         const unsigned char **cv, size_t *cv_size,
                         const unsigned char **dm, size_t *dm_size,
                         size_t *dm_width, size_t *dm_height, image_type_t *dm_type,
                         uint32_t *orientation) {
    const size_t dm_header_size = 64;

    // check if file ends with "DepthEn\0"
    static const char HUAWEI_END_MARKER[] = {'D', 'e', 'p', 't', 'h', 'E', 'n', '\0'};

    const unsigned char *iter = data + size - sizeof(HUAWEI_END_MARKER);

    if (iter < data) {
        // fprintf(stderr, "filesize too small\n");
        return 0;
    }

    if (memcmp(iter, HUAWEI_END_MARKER, sizeof(HUAWEI_END_MARKER))) {
        // fprintf(stderr, "trailer doesn't end with \"DepthEn\\0\"\n");
        return 0;
    }

    // The 4 bytes before that are the relative jump to the start of the depth map structure
    iter -= 4;
    if (iter < data) {
        // fprintf(stderr, "filesize too small\n");
        return 0;
    }
    const uint32_t dm_block_size = read_ui32(iter);

    // go to the start of the data structure where the depth map is in
    iter -= dm_block_size;
    if (iter < data) {
        // fprintf(stderr, "filesize too small\n");
        return 0;
    }
    const unsigned char *dm_start = iter;
    const unsigned char *dm_data_start = dm_start + dm_header_size;

    print_hex(file_data, dm_start, dm_header_size);

    switch(dm_start[3]) {
        case 0x10: *orientation = 1; break;
        case 0x11: *orientation = 8; break;
        case 0x12: *orientation = 3; break;
        case 0x13: *orientation = 6; break;
        default: break;
    }

    const uint16_t width = read_ui16(dm_start + 12);
    const uint16_t height = read_ui16(dm_start + 14);

    if (width * height > dm_block_size) {
        // fprintf(stderr, "broken file\n");
        return 0;
    }

    // now we need the original color image
    iter = dm_start - 12;
    if (iter < data) {
        // fprintf(stderr, "filesize too small\n");
        return 0;
    }

    if (memcmp(iter + 4, "edof", 4) || read_ui32(iter + 8) != 0) {
        // fprintf(stderr, "unexpected file content\n");
        return 0;
    }

    const uint32_t jpeg_size = read_ui32(iter);

    iter -= jpeg_size;
    if (iter < data) {
        // fprintf(stderr, "filesize too small\n");
        return 0;
    }

    const unsigned char *jpeg_data_start = iter;

    *cv = jpeg_data_start;
    *cv_size = jpeg_size;
    *dm = dm_data_start;
    *dm_size = width * height;
    *dm_width = width;
    *dm_height = height;
    *dm_type = TYPE_RAW;

    return 1;
}